

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int vcf_hdr_write(htsFile *fp,bcf_hdr_t *h)

{
  BGZF *fp_00;
  char *__src;
  long lVar1;
  ulong __n;
  ulong uVar2;
  ulong totalbytes;
  int hlen;
  int local_2c;
  
  __src = bcf_hdr_fmt_text(h,0,&local_2c);
  lVar1 = (long)local_2c;
  if (lVar1 != 0) {
    do {
      if (__src[lVar1 + -1] != '\0') goto LAB_00116122;
      local_2c = (int)lVar1 + -1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
    lVar1 = 0;
  }
LAB_00116122:
  fp_00 = (BGZF *)(fp->fp).hfile;
  totalbytes = (ulong)(int)lVar1;
  if ((fp->format).compression == no_compression) {
    uVar2 = fp_00->uncompressed_address - (long)*(void **)&fp_00->block_length;
    __n = totalbytes;
    if (uVar2 < totalbytes) {
      __n = uVar2;
    }
    memcpy(*(void **)&fp_00->block_length,__src,__n);
    *(ulong *)&fp_00->block_length = *(long *)&fp_00->block_length + __n;
    if (uVar2 < totalbytes) {
      __n = hwrite2((hFILE *)fp_00,__src,totalbytes,__n);
    }
  }
  else {
    __n = bgzf_write(fp_00,__src,totalbytes);
  }
  free(__src);
  return (int)((ulong)(long)(int)__n >> 0x1f);
}

Assistant:

int vcf_hdr_write(htsFile *fp, const bcf_hdr_t *h)
{
    int hlen;
    char *htxt = bcf_hdr_fmt_text(h, 0, &hlen);
    while (hlen && htxt[hlen-1] == 0) --hlen; // kill trailing zeros
    int ret;
    if ( fp->format.compression!=no_compression )
        ret = bgzf_write(fp->fp.bgzf, htxt, hlen);
    else
        ret = hwrite(fp->fp.hfile, htxt, hlen);
    free(htxt);
    return ret<0 ? -1 : 0;
}